

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCl.c
# Opt level: O2

Gia_Man_t * Acec_ManDecla(Gia_Man_t *pGia,int fBooth,int fVerbose)

{
  abctime aVar1;
  Vec_Bit_t *vIgnore;
  Acec_Box_t *pBox_00;
  Vec_Int_t *vRes;
  Gia_Man_t *pGVar2;
  abctime aVar3;
  abctime time;
  Vec_Int_t *pStr;
  Acec_Box_t *pBox;
  Acec_Box_t *local_30;
  
  aVar1 = Abc_Clock();
  if (fBooth == 0) {
    vIgnore = (Vec_Bit_t *)0x0;
  }
  else {
    vIgnore = Acec_BoothFindPPG(pGia);
  }
  pBox_00 = Acec_DeriveBox(pGia,vIgnore,0,0,fVerbose);
  local_30 = pBox_00;
  if (vIgnore != (Vec_Bit_t *)0x0) {
    free(vIgnore->pArray);
    free(vIgnore);
  }
  if (pBox_00 != (Acec_Box_t *)0x0) {
    vRes = Acec_RewriteTop(pGia,pBox_00);
    Acec_BoxFreeP(&local_30);
    pStr = vRes;
    pGVar2 = Acec_RewriteReplace(pGia,vRes);
    Vec_IntFree(vRes);
    aVar3 = Abc_Clock();
    Abc_PrintTime((int)aVar3 - (int)aVar1,(char *)pStr,time);
    return pGVar2;
  }
  puts("Cannot find arithmetic boxes.");
  pGVar2 = Gia_ManDup(pGia);
  return pGVar2;
}

Assistant:

Gia_Man_t * Acec_ManDecla( Gia_Man_t * pGia, int fBooth, int fVerbose )
{
    abctime clk = Abc_Clock();
    Gia_Man_t * pNew = NULL;
    Vec_Bit_t * vIgnore = fBooth ? Acec_BoothFindPPG(pGia) : NULL;
    Acec_Box_t * pBox = Acec_DeriveBox( pGia, vIgnore, 0, 0, fVerbose );
    Vec_Int_t * vResult;
    Vec_BitFreeP( &vIgnore );
    if ( pBox == NULL ) // cannot match
    {
        printf( "Cannot find arithmetic boxes.\n" );
        return Gia_ManDup( pGia );
    }
    vResult = Acec_RewriteTop( pGia, pBox );
    Acec_BoxFreeP( &pBox );
    pNew = Acec_RewriteReplace( pGia, vResult );
    Vec_IntFree( vResult );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return pNew;
}